

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metrics.cpp
# Opt level: O2

void __thiscall wasm::Metrics::printCounts(Metrics *this,string *title)

{
  uint *puVar1;
  long lVar2;
  long lVar3;
  pointer ppcVar4;
  _Base_ptr p_Var5;
  mapped_type_conflict1 *pmVar6;
  ostream *poVar7;
  size_type sVar8;
  long *plVar9;
  int iVar10;
  undefined1 auVar11 [8];
  int iVar12;
  undefined1 auStack_58 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> keys;
  char *local_38;
  char *key;
  
  auStack_58 = (undefined1  [8])0x0;
  keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&this->counts;
  iVar10 = 0;
  for (p_Var5 = (this->counts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(this->counts)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)auStack_58,
               (value_type *)(p_Var5 + 1));
    iVar12 = 0;
    if (**(char **)(p_Var5 + 1) != '[') {
      iVar12 = *(int *)&p_Var5[1]._M_parent;
    }
    iVar10 = iVar10 + iVar12;
  }
  local_38 = "[total]";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)auStack_58,&local_38);
  local_38 = "[total]";
  pmVar6 = std::
           map<const_char_*,_int,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
           ::operator[]((map<const_char_*,_int,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
                         *)keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,&local_38);
  *pmVar6 = iVar10;
  std::
  __sort<__gnu_cxx::__normal_iterator<char_const**,std::vector<char_const*,std::allocator<char_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<wasm::Metrics::printCounts(std::__cxx11::string)::_lambda(char_const*,char_const*)_1_>>
            (auStack_58,
             keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start);
  poVar7 = std::operator<<((ostream *)&std::cout,(string *)title);
  std::operator<<(poVar7,"\n");
  ppcVar4 = keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (auVar11 = auStack_58; auVar11 != (undefined1  [8])ppcVar4;
      auVar11 = (undefined1  [8])((long)auVar11 + 8)) {
    local_38 = *(char **)auVar11;
    pmVar6 = std::
             map<const_char_*,_int,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
             ::operator[]((map<const_char_*,_int,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
                           *)keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,&local_38);
    iVar10 = *pmVar6;
    if ((iVar10 != 0) || (*local_38 == '[')) {
      poVar7 = std::operator<<((ostream *)&std::cout," ");
      lVar2 = *(long *)poVar7;
      lVar3 = *(long *)(lVar2 + -0x18);
      *(uint *)(poVar7 + lVar3 + 0x18) = *(uint *)(poVar7 + lVar3 + 0x18) & 0xffffff4f | 0x20;
      *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 0xf;
      poVar7 = std::operator<<(poVar7,local_38);
      poVar7 = std::operator<<(poVar7,": ");
      *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 8;
      std::ostream::operator<<(poVar7,iVar10);
      sVar8 = std::
              map<const_char_*,_int,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
              ::count((map<const_char_*,_int,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
                       *)lastCounts,&local_38);
      if (sVar8 != 0) {
        pmVar6 = std::
                 map<const_char_*,_int,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
                 ::operator[]((map<const_char_*,_int,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
                               *)lastCounts,&local_38);
        iVar12 = iVar10 - *pmVar6;
        if (iVar12 != 0) {
          if (iVar12 == 0 || iVar10 < *pmVar6) {
            Colors::green((ostream *)&std::cout);
          }
          else {
            Colors::red((ostream *)&std::cout);
          }
          lVar2 = std::cout;
          *(uint *)(operator_new__ + *(long *)(std::cout + -0x18)) =
               *(uint *)(operator_new__ + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x80;
          *(undefined8 *)(std::__throw_bad_array_new_length + *(long *)(lVar2 + -0x18)) = 8;
          *(uint *)(operator_new__ + *(long *)(lVar2 + -0x18)) =
               *(uint *)(operator_new__ + *(long *)(lVar2 + -0x18)) | 0x800;
          plVar9 = (long *)std::ostream::operator<<(&std::cout,iVar12);
          puVar1 = (uint *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x18);
          *puVar1 = *puVar1 & 0xfffff7ff;
          Colors::normal((ostream *)&std::cout);
        }
      }
      std::operator<<((ostream *)&std::cout,"\n");
    }
  }
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)auStack_58);
  return;
}

Assistant:

void printCounts(std::string title) {
    using std::left;
    using std::noshowpos;
    using std::right;
    using std::setw;
    using std::showpos;

    std::ostream& o = std::cout;
    std::vector<const char*> keys;
    // add total
    int total = 0;
    for (auto& [key, value] : counts) {
      keys.push_back(key);
      // total is of all the normal stuff, not the special [things]
      if (key[0] != '[') {
        total += value;
      }
    }
    keys.push_back("[total]");
    counts["[total]"] = total;
    // sort
    sort(keys.begin(), keys.end(), [](const char* a, const char* b) -> bool {
      // Sort the [..] ones first.
      if (a[0] == '[' && b[0] != '[') {
        return true;
      }
      if (a[0] != '[' && b[0] == '[') {
        return false;
      }
      return strcmp(b, a) > 0;
    });
    o << title << "\n";
    for (auto* key : keys) {
      auto value = counts[key];
      if (value == 0 && key[0] != '[') {
        continue;
      }
      o << " " << left << setw(15) << key << ": " << setw(8) << value;
      if (lastCounts.count(key)) {
        int before = lastCounts[key];
        int after = value;
        if (after - before) {
          if (after > before) {
            Colors::red(o);
          } else {
            Colors::green(o);
          }
          o << right << setw(8);
          o << showpos << after - before << noshowpos;
          Colors::normal(o);
        }
      }
      o << "\n";
    }
  }